

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paint.h
# Opt level: O0

void gimage::paste<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image2,long i0,long k0,
               int d0,float opacity)

{
  float fVar1;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this;
  byte bVar2;
  byte bVar3;
  store_t v_00;
  int iVar4;
  int iVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  long in_RCX;
  long in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  int in_R8D;
  float in_XMM0_Da;
  float fVar9;
  long i_1;
  long k_1;
  int d_1;
  float v;
  long i;
  long k;
  int d;
  long local_58;
  long local_50;
  int local_48;
  long local_40;
  long local_38;
  int local_30;
  float local_2c;
  float local_28;
  int local_24;
  long local_20;
  long local_18;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_8;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (1.0 <= in_XMM0_Da) {
    for (local_48 = 0;
        iVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
        local_48 < iVar4; local_48 = local_48 + 1) {
      if ((-1 < local_24 + local_48) &&
         (iVar4 = local_24 + local_48,
         iVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_8),
         iVar4 < iVar5)) {
        for (local_50 = 0;
            lVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10),
            local_50 < lVar7; local_50 = local_50 + 1) {
          if ((-1 < local_20 + local_50) &&
             (lVar7 = local_20 + local_50,
             lVar8 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_8),
             lVar7 < lVar8)) {
            for (local_58 = 0;
                lVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                                  (local_10), local_58 < lVar7; local_58 = local_58 + 1) {
              if ((-1 < local_18 + local_58) &&
                 (lVar7 = local_18 + local_58,
                 lVar8 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                                   (local_8), this = local_8, lVar7 < lVar8)) {
                lVar7 = local_18 + local_58;
                lVar8 = local_20 + local_50;
                iVar4 = local_24 + local_48;
                v_00 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                                 (local_10,local_58,local_50,local_48);
                Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                          (this,lVar7,lVar8,iVar4,v_00);
              }
            }
          }
        }
      }
    }
  }
  else {
    local_2c = 0.0;
    pfVar6 = std::max<float>(&local_2c,&local_28);
    local_28 = *pfVar6;
    for (local_30 = 0;
        iVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
        local_30 < iVar4; local_30 = local_30 + 1) {
      if ((-1 < local_24 + local_30) &&
         (iVar4 = local_24 + local_30,
         iVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_8),
         iVar4 < iVar5)) {
        for (local_38 = 0;
            lVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10),
            local_38 < lVar7; local_38 = local_38 + 1) {
          if ((-1 < local_20 + local_38) &&
             (lVar7 = local_20 + local_38,
             lVar8 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_8),
             lVar7 < lVar8)) {
            for (local_40 = 0;
                lVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                                  (local_10), local_40 < lVar7; local_40 = local_40 + 1) {
              if ((-1 < local_18 + local_40) &&
                 (lVar7 = local_18 + local_40,
                 lVar8 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                                   (local_8), lVar7 < lVar8)) {
                fVar9 = 1.0 - local_28;
                bVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                                  (local_8,local_18 + local_40,local_20 + local_38,
                                   local_24 + local_30);
                fVar1 = local_28;
                bVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                                  (local_10,local_40,local_38,local_30);
                Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                          (local_8,local_18 + local_40,local_20 + local_38,local_24 + local_30,
                           (store_t)(int)(fVar1 * (float)bVar3 + fVar9 * (float)bVar2));
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void paste(Image<T> &image, const Image<T> &image2, long i0=0, long k0=0,
                             int d0=0, float opacity=1.0f)
{
  if (opacity < 1)
  {
    opacity=std::max(0.0f, opacity);

    for (int d=0; d<image2.getDepth(); d++)
      if (d0+d >= 0 && d0+d < image.getDepth())
        for (long k=0; k<image2.getHeight(); k++)
          if (k0+k >= 0 && k0+k < image.getHeight())
            for (long i=0; i<image2.getWidth(); i++)
              if (i0+i >= 0 && i0+i < image.getWidth())
              {
                float v=(1-opacity)*image.get(i0+i, k0+k, d0+d);
                v+=opacity*image2.get(i, k, d);
                image.set(i0+i, k0+k, d0+d, static_cast<typename Image<T>::store_t>(v));
              }
  }
  else
  {
    for (int d=0; d<image2.getDepth(); d++)
      if (d0+d >= 0 && d0+d < image.getDepth())
        for (long k=0; k<image2.getHeight(); k++)
          if (k0+k >= 0 && k0+k < image.getHeight())
            for (long i=0; i<image2.getWidth(); i++)
              if (i0+i >= 0 && i0+i < image.getWidth())
              {
                image.set(i0+i, k0+k, d0+d, image2.get(i, k, d));
              }
  }
}